

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void write_archive(archive *a,bsdtar *bsdtar)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  void *pvVar4;
  archive_entry_linkresolver *paVar5;
  archive *paVar6;
  archive_entry *e;
  int64_t n0;
  char *pcVar7;
  long in_RSI;
  archive *in_RDI;
  archive *disk;
  archive_entry *entry2;
  int r;
  archive_entry *sparse_entry;
  archive_entry *entry;
  char *arg;
  archive_entry *in_stack_ffffffffffffff98;
  FILE *__stream;
  uint in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa4;
  archive *in_stack_ffffffffffffffa8;
  archive *paVar8;
  undefined4 in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffc0;
  bsdtar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive *in_stack_ffffffffffffffd8;
  bsdtar *in_stack_ffffffffffffffe0;
  long lVar9;
  
  *(undefined8 *)(in_RSI + 0xe8) = 0x10000;
  while (*(ulong *)(in_RSI + 0xe8) < (ulong)(long)*(int *)(in_RSI + 0x18)) {
    *(long *)(in_RSI + 0xe8) = *(long *)(in_RSI + 0xe8) << 1;
  }
  *(long *)(in_RSI + 0xe8) = *(long *)(in_RSI + 0xe8) + 0x4000;
  pvVar4 = malloc(*(size_t *)(in_RSI + 0xe8));
  *(void **)(in_RSI + 0xe0) = pvVar4;
  if (pvVar4 == (void *)0x0) {
    lafe_errc(1,0,"cannot allocate memory");
  }
  paVar5 = archive_entry_linkresolver_new();
  *(archive_entry_linkresolver **)(in_RSI + 200) = paVar5;
  if (paVar5 == (archive_entry_linkresolver *)0x0) {
    lafe_errc(1,0,"cannot create link resolver");
  }
  paVar8 = *(archive **)(in_RSI + 200);
  iVar1 = archive_format(in_RDI);
  archive_entry_linkresolver_set_strategy((archive_entry_linkresolver *)paVar8,iVar1);
  paVar6 = archive_read_disk_new();
  *(archive **)(in_RSI + 0xc0) = paVar6;
  if (paVar6 == (archive *)0x0) {
    lafe_errc(1,0,"Cannot create read_disk object");
  }
  iVar1 = (int)*(char *)(in_RSI + 0x51);
  if (iVar1 == 0x48) {
    archive_read_disk_set_symlink_hybrid(in_stack_ffffffffffffffa8);
  }
  else if (iVar1 == 0x4c) {
    archive_read_disk_set_symlink_logical(in_stack_ffffffffffffffa8);
  }
  else {
    archive_read_disk_set_symlink_physical(in_stack_ffffffffffffffa8);
  }
  archive_read_disk_set_matching
            (paVar8,(archive *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
             (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)in_stack_ffffffffffffffa8,
             (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  archive_read_disk_set_metadata_filter_callback
            (paVar8,(_func_int_archive_ptr_void_ptr_archive_entry_ptr *)
                    CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  archive_read_disk_set_behavior(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  archive_read_disk_set_standard_lookup(in_stack_ffffffffffffffa8);
  if (*(long *)(in_RSI + 0x10) != 0) {
    archive_names_from_file
              ((bsdtar *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  }
  while (**(long **)(in_RSI + 0x90) != 0) {
    pcVar7 = (char *)**(undefined8 **)(in_RSI + 0x90);
    if ((*pcVar7 == '-') && (pcVar7[1] == 'C')) {
      if (pcVar7[2] == '\0') {
        *(long *)(in_RSI + 0x90) = *(long *)(in_RSI + 0x90) + 8;
        if ((char *)**(undefined8 **)(in_RSI + 0x90) == (char *)0x0) {
          lafe_warnc(0,"%s","Missing argument for -C");
          *(undefined4 *)(in_RSI + 0xb4) = 1;
          goto LAB_00114ea9;
        }
        if (*(char *)**(undefined8 **)(in_RSI + 0x90) == '\0') {
          lafe_warnc(0,"Meaningless argument for -C: \'\'");
          *(undefined4 *)(in_RSI + 0xb4) = 1;
          goto LAB_00114ea9;
        }
      }
      set_chdir((bsdtar_conflict *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                (char *)in_stack_ffffffffffffffa8);
    }
    else {
      if ((*pcVar7 != '/') && ((*pcVar7 != '@' || (pcVar7[1] != '/')))) {
        do_chdir((bsdtar_conflict *)0x114c44);
      }
      if (*pcVar7 == '@') {
        iVar2 = append_archive_filename
                          (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(char *)paVar8);
        if (iVar2 != 0) break;
      }
      else {
        write_hierarchy(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
    *(long *)(in_RSI + 0x90) = *(long *)(in_RSI + 0x90) + 8;
  }
  archive_read_disk_set_matching
            (paVar8,(archive *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
             (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)in_stack_ffffffffffffffa8,
             (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  archive_read_disk_set_metadata_filter_callback
            (paVar8,(_func_int_archive_ptr_void_ptr_archive_entry_ptr *)
                    CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  lVar9 = 0;
  archive_entry_linkify
            ((archive_entry_linkresolver *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (archive_entry **)in_stack_ffffffffffffffc8,(archive_entry **)in_stack_ffffffffffffffc0
            );
  while (lVar9 != 0) {
    paVar8 = *(archive **)(in_RSI + 0xc0);
    paVar6 = paVar8;
    archive_entry_sourcepath(in_stack_ffffffffffffff98);
    wVar3 = archive_read_disk_open
                      (paVar8,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    if (wVar3 == L'\0') {
      e = archive_entry_new();
      iVar1 = archive_read_next_header2
                        ((archive *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      archive_entry_free((archive_entry *)0x114db6);
      if (iVar1 == 0) {
        write_file((bsdtar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (archive *)in_stack_ffffffffffffff98,(archive_entry *)0x114e2f);
        archive_entry_free((archive_entry *)0x114e39);
        archive_read_close((archive *)0x114e43);
        lVar9 = 0;
        archive_entry_linkify
                  ((archive_entry_linkresolver *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                   (archive_entry **)e,(archive_entry **)paVar6);
      }
      else {
        in_stack_ffffffffffffffa0 = archive_errno(paVar6);
        pcVar7 = archive_error_string(paVar6);
        lafe_warnc((int)(ulong)in_stack_ffffffffffffffa0,"%s",pcVar7);
        if (iVar1 == -0x1e) {
          *(undefined4 *)(in_RSI + 0xb4) = 1;
        }
        else {
          archive_read_close((archive *)0x114e0c);
        }
        archive_entry_free((archive_entry *)0x114e16);
      }
    }
    else {
      in_stack_ffffffffffffffa4 = archive_errno(paVar6);
      pcVar7 = archive_error_string(paVar6);
      lafe_warnc((int)(ulong)(uint)in_stack_ffffffffffffffa4,"%s",pcVar7);
      *(undefined4 *)(in_RSI + 0xb4) = 1;
      archive_entry_free((archive_entry *)0x114d8a);
    }
  }
  iVar1 = archive_write_close((archive *)0x114e76);
  if (iVar1 != 0) {
    pcVar7 = archive_error_string(in_RDI);
    lafe_warnc(0,"%s",pcVar7);
    *(undefined4 *)(in_RSI + 0xb4) = 1;
  }
LAB_00114ea9:
  free(*(void **)(in_RSI + 0xe0));
  archive_entry_linkresolver_free
            ((archive_entry_linkresolver *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  *(undefined8 *)(in_RSI + 200) = 0;
  archive_read_free((archive *)0x114eec);
  *(undefined8 *)(in_RSI + 0xc0) = 0;
  if (*(char *)(in_RSI + 0x67) != '\0') {
    __stream = _stderr;
    n0 = archive_filter_bytes
                   ((archive *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (int)((ulong)_stderr >> 0x20));
    pcVar7 = tar_i64toa(n0);
    fprintf(__stream,"Total bytes written: %s\n",pcVar7);
  }
  archive_write_free((archive *)0x114f4b);
  return;
}

Assistant:

static void
write_archive(struct archive *a, struct bsdtar *bsdtar)
{
	const char *arg;
	struct archive_entry *entry, *sparse_entry;

	/* Choose a suitable copy buffer size */
	bsdtar->buff_size = 64 * 1024;
	while (bsdtar->buff_size < (size_t)bsdtar->bytes_per_block)
	  bsdtar->buff_size *= 2;
	/* Try to compensate for space we'll lose to alignment. */
	bsdtar->buff_size += 16 * 1024;

	/* Allocate a buffer for file data. */
	if ((bsdtar->buff = malloc(bsdtar->buff_size)) == NULL)
		lafe_errc(1, 0, "cannot allocate memory");

	if ((bsdtar->resolver = archive_entry_linkresolver_new()) == NULL)
		lafe_errc(1, 0, "cannot create link resolver");
	archive_entry_linkresolver_set_strategy(bsdtar->resolver,
	    archive_format(a));

	/* Create a read_disk object. */
	if ((bsdtar->diskreader = archive_read_disk_new()) == NULL)
		lafe_errc(1, 0, "Cannot create read_disk object");
	/* Tell the read_disk how handle symlink. */
	switch (bsdtar->symlink_mode) {
	case 'H':
		archive_read_disk_set_symlink_hybrid(bsdtar->diskreader);
		break;
	case 'L':
		archive_read_disk_set_symlink_logical(bsdtar->diskreader);
		break;
	default:
		archive_read_disk_set_symlink_physical(bsdtar->diskreader);
		break;
	}
	/* Register entry filters. */
	archive_read_disk_set_matching(bsdtar->diskreader,
	    bsdtar->matching, excluded_callback, bsdtar);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, metadata_filter, bsdtar);
	/* Set the behavior of archive_read_disk. */
	archive_read_disk_set_behavior(bsdtar->diskreader,
	    bsdtar->readdisk_flags);
	archive_read_disk_set_standard_lookup(bsdtar->diskreader);

	if (bsdtar->names_from_file != NULL)
		archive_names_from_file(bsdtar, a);

	while (*bsdtar->argv) {
		arg = *bsdtar->argv;
		if (arg[0] == '-' && arg[1] == 'C') {
			arg += 2;
			if (*arg == '\0') {
				bsdtar->argv++;
				arg = *bsdtar->argv;
				if (arg == NULL) {
					lafe_warnc(0, "%s",
					    "Missing argument for -C");
					bsdtar->return_value = 1;
					goto cleanup;
				}
				if (*arg == '\0') {
					lafe_warnc(0,
					    "Meaningless argument for -C: ''");
					bsdtar->return_value = 1;
					goto cleanup;
				}
			}
			set_chdir(bsdtar, arg);
		} else {
			if (*arg != '/' && (arg[0] != '@' || arg[1] != '/'))
				do_chdir(bsdtar); /* Handle a deferred -C */
			if (*arg == '@') {
				if (append_archive_filename(bsdtar, a,
				    arg + 1) != 0)
					break;
			} else
				write_hierarchy(bsdtar, a, arg);
		}
		bsdtar->argv++;
	}

	archive_read_disk_set_matching(bsdtar->diskreader, NULL, NULL, NULL);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, NULL, NULL);
	entry = NULL;
	archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	while (entry != NULL) {
		int r;
		struct archive_entry *entry2;
		struct archive *disk = bsdtar->diskreader;

		/*
		 * This tricky code here is to correctly read the cotents
		 * of the entry because the disk reader bsdtar->diskreader
		 * is pointing at does not have any information about the
		 * entry by this time and using archive_read_data_block()
		 * with the disk reader consequently must fail. And we
		 * have to re-open the entry to read the contents.
		 */
		/* TODO: Work with -C option as well. */
		r = archive_read_disk_open(disk,
			archive_entry_sourcepath(entry));
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			bsdtar->return_value = 1;
			archive_entry_free(entry);
			continue;
		}

		/*
		 * Invoke archive_read_next_header2() to work
		 * archive_read_data_block(), which is called via write_file(),
		 * without failure.
		 */
		entry2 = archive_entry_new();
		r = archive_read_next_header2(disk, entry2);
		archive_entry_free(entry2);
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL)
				bsdtar->return_value = 1;
			else
				archive_read_close(disk);
			archive_entry_free(entry);
			continue;
		}

		write_file(bsdtar, a, entry);
		archive_entry_free(entry);
		archive_read_close(disk);
		entry = NULL;
		archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	}

	if (archive_write_close(a)) {
		lafe_warnc(0, "%s", archive_error_string(a));
		bsdtar->return_value = 1;
	}

cleanup:
	/* Free file data buffer. */
	free(bsdtar->buff);
	archive_entry_linkresolver_free(bsdtar->resolver);
	bsdtar->resolver = NULL;
	archive_read_free(bsdtar->diskreader);
	bsdtar->diskreader = NULL;

	if (bsdtar->option_totals) {
		fprintf(stderr, "Total bytes written: %s\n",
		    tar_i64toa(archive_filter_bytes(a, -1)));
	}

	archive_write_free(a);
}